

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_alignment.c
# Opt level: O3

char * ps_alignment_iter_name(ps_alignment_iter_t *itor)

{
  ps_alignment_t *ppVar1;
  ps_alignment_vector_t *ppVar2;
  ps_alignment_entry_t *ppVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  long ln;
  
  if (itor != (ps_alignment_iter_t *)0x0) {
    ppVar1 = itor->al;
    ppVar2 = itor->vec;
    iVar5 = itor->pos;
    ppVar3 = ppVar2->seq;
    if (ppVar2 == &ppVar1->word) {
      if (-1 < (long)ppVar3[iVar5].id.wid) {
        return ppVar1->d2p->dict->word[ppVar3[iVar5].id.wid].word;
      }
    }
    else {
      if (ppVar2 == &ppVar1->sseq) {
        pcVar6 = bin_mdef_ciphone_str(ppVar1->d2p->mdef,(int)ppVar3[iVar5].id.pid.cipid);
        return pcVar6;
      }
      if (ppVar2 == &ppVar1->state) {
        iVar4 = snprintf((char *)0x0,0,"%u",(ulong)ppVar3[iVar5].id.senid);
        if (iVar4 == 0) {
          ln = 0x1a7;
        }
        else {
          if (itor->name != (char *)0x0) {
            ckd_free(itor->name);
          }
          pcVar6 = (char *)__ckd_malloc__((long)(iVar4 + 1),
                                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_alignment.c"
                                          ,0x1ac);
          itor->name = pcVar6;
          iVar5 = snprintf(pcVar6,(long)(iVar4 + 1),"%u",(ulong)ppVar3[iVar5].id.senid);
          if (iVar5 == iVar4) {
            return itor->name;
          }
          ln = 0x1ae;
        }
        err_msg_system(ERR_ERROR,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_alignment.c"
                       ,ln,"snprintf() failed");
        return (char *)0x0;
      }
    }
  }
  return (char *)0x0;
}

Assistant:

const char *
ps_alignment_iter_name(ps_alignment_iter_t *itor)
{
    ps_alignment_entry_t *ent;
    if (itor == NULL)
        return NULL;
    ent = ps_alignment_iter_get(itor);
    if (itor->vec == &itor->al->word) {
        return dict_wordstr(itor->al->d2p->dict,
                            ent->id.wid);
    }
    else if (itor->vec == &itor->al->sseq) {
        return bin_mdef_ciphone_str(itor->al->d2p->mdef,
                                    ent->id.pid.cipid);
    }
    else if (itor->vec == &itor->al->state) {
        int len = snprintf(NULL, 0, "%u", ent->id.senid);
        if (len == 0) {
            E_ERROR_SYSTEM("snprintf() failed");
            return NULL;
        }
        if (itor->name)
            ckd_free(itor->name);
        itor->name = ckd_malloc(len + 1);
        if (snprintf(itor->name, len + 1, "%u", ent->id.senid) != len) {
            E_ERROR_SYSTEM("snprintf() failed");
            return NULL;
        }
        return itor->name;
    }
    else
        return NULL;
}